

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

void vkt::shaderexecutor::generateSources
               (ShaderType shaderType,ShaderSpec *shaderSpec,SourceCollections *dst)

{
  InternalError *this;
  SourceCollections *dst_local;
  ShaderSpec *shaderSpec_local;
  ShaderType shaderType_local;
  
  switch(shaderType) {
  case SHADERTYPE_VERTEX:
    anon_unknown_0::VertexShaderExecutor::generateSources(shaderSpec,dst);
    break;
  case SHADERTYPE_FRAGMENT:
    anon_unknown_0::FragmentShaderExecutor::generateSources(shaderSpec,dst);
    break;
  case SHADERTYPE_GEOMETRY:
    anon_unknown_0::GeometryShaderExecutor::generateSources(shaderSpec,dst);
    break;
  case SHADERTYPE_TESSELLATION_CONTROL:
    anon_unknown_0::TessControlExecutor::generateSources(shaderSpec,dst);
    break;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    anon_unknown_0::TessEvaluationExecutor::generateSources(shaderSpec,dst);
    break;
  case SHADERTYPE_COMPUTE:
    anon_unknown_0::ComputeShaderExecutor::generateSources(shaderSpec,dst);
    break;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,"Unsupported shader type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
               ,0xb2b);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return;
}

Assistant:

void generateSources (glu::ShaderType shaderType, const ShaderSpec& shaderSpec, vk::SourceCollections& dst)
{
	switch (shaderType)
	{
		case glu::SHADERTYPE_VERTEX:					VertexShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_TESSELLATION_CONTROL:		TessControlExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_TESSELLATION_EVALUATION:	TessEvaluationExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_GEOMETRY:					GeometryShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_FRAGMENT:					FragmentShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_COMPUTE:					ComputeShaderExecutor::generateSources	(shaderSpec, dst);	break;
		default:
			TCU_THROW(InternalError, "Unsupported shader type");
	}
}